

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Bar.cxx
# Opt level: O3

int __thiscall Fl_Menu_Bar::handle(Fl_Menu_Bar *this,int event)

{
  int iVar1;
  Fl_Menu_Item *pFVar2;
  Fl_Menu_Item *initial_item;
  
  pFVar2 = (this->super_Fl_Menu_).menu_;
  if ((pFVar2 == (Fl_Menu_Item *)0x0) || (pFVar2->text == (char *)0x0)) {
    return 0;
  }
  if (event - 3U < 2) {
    return 1;
  }
  if (event == 0xc) {
    iVar1 = Fl_Widget::visible_r((Fl_Widget *)this);
    if (((iVar1 == 0) ||
        (initial_item = Fl_Menu_Item::find_shortcut((this->super_Fl_Menu_).menu_,(int *)0x0,true),
        initial_item == (Fl_Menu_Item *)0x0)) || ((initial_item->flags & 0x60) == 0)) {
      pFVar2 = Fl_Menu_Item::test_shortcut((this->super_Fl_Menu_).menu_);
      pFVar2 = Fl_Menu_::picked(&this->super_Fl_Menu_,pFVar2);
      return (uint)(pFVar2 != (Fl_Menu_Item *)0x0);
    }
    pFVar2 = (this->super_Fl_Menu_).menu_;
  }
  else {
    if (event != 1) {
      return 0;
    }
    initial_item = (Fl_Menu_Item *)0x0;
  }
  pFVar2 = Fl_Menu_Item::pulldown
                     (pFVar2,(this->super_Fl_Menu_).super_Fl_Widget.x_,
                      (this->super_Fl_Menu_).super_Fl_Widget.y_,
                      (this->super_Fl_Menu_).super_Fl_Widget.w_,
                      (this->super_Fl_Menu_).super_Fl_Widget.h_,initial_item,&this->super_Fl_Menu_,
                      (Fl_Menu_Item *)0x0,1);
  Fl_Menu_::picked(&this->super_Fl_Menu_,pFVar2);
  return 1;
}

Assistant:

int Fl_Menu_Bar::handle(int event) {
  const Fl_Menu_Item* v;
  if (menu() && menu()->text) switch (event) {
  case FL_ENTER:
  case FL_LEAVE:
    return 1;
  case FL_PUSH:
    v = 0;
  J1:
    v = menu()->pulldown(x(), y(), w(), h(), v, this, 0, 1);
    picked(v);
    return 1;
  case FL_SHORTCUT:
    if (visible_r()) {
      v = menu()->find_shortcut(0, true);
      if (v && v->submenu()) goto J1;
    }
    return test_shortcut() != 0;
  }
  return 0;
}